

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_utf8.c
# Opt level: O0

int u8_utf8toucs2(uint16_t *dest,int sz,char *src,int srcsz)

{
  int iVar1;
  int local_38;
  int i;
  int nb;
  char *src_end;
  uint16_t ch;
  byte *pbStack_20;
  int srcsz_local;
  char *src_local;
  int sz_local;
  uint16_t *dest_local;
  
  local_38 = 0;
  pbStack_20 = (byte *)src;
  while (local_38 < sz + -1) {
    iVar1 = (int)""[*pbStack_20];
    if (srcsz == -1) {
      if (*pbStack_20 == 0) break;
    }
    else if (src + srcsz <= pbStack_20 + iVar1) break;
    src_end._2_2_ = 0;
    switch(iVar1) {
    case 3:
      pbStack_20 = pbStack_20 + 1;
    case 2:
      src_end._2_2_ = (ushort)*pbStack_20 << 6;
      pbStack_20 = pbStack_20 + 1;
    case 1:
      src_end._2_2_ = (src_end._2_2_ + (ushort)*pbStack_20) * 0x40;
      pbStack_20 = pbStack_20 + 1;
    case 0:
      src_end._2_2_ = src_end._2_2_ + (ushort)*pbStack_20;
      pbStack_20 = pbStack_20 + 1;
    default:
      dest[local_38] = src_end._2_2_ - (short)offsetsFromUTF8[iVar1];
      local_38 = local_38 + 1;
    }
  }
  dest[local_38] = 0;
  return local_38;
}

Assistant:

int u8_utf8toucs2(uint16_t *dest, int sz, const char *src, int srcsz)
{
    uint16_t ch;
    const char *src_end = src + srcsz;
    int nb;
    int i=0;

    while (i < sz-1) {
        nb = trailingBytesForUTF8[(unsigned char)*src];
        if (srcsz == -1) {
            if (*src == 0)
                goto done_toucs;
        }
        else {
            if (src + nb >= src_end)
                goto done_toucs;
        }
        ch = 0;
        switch (nb) {
        case 3: ch += (unsigned char)*src++; ch <<= 6; /* falls through */
        case 2: ch += (unsigned char)*src++; ch <<= 6; /* falls through */
        case 1: ch += (unsigned char)*src++; ch <<= 6; /* falls through */
        case 0: ch += (unsigned char)*src++; /* falls through */
        }
        ch -= offsetsFromUTF8[nb];
        dest[i++] = ch;
    }
 done_toucs:
    dest[i] = 0;
    return i;
}